

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.h
# Opt level: O2

bool __thiscall ami_nvar_t::nvar_entry_t::_is_null_signature_rest(nvar_entry_t *this)

{
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,(string *)&this->m_signature_rest);
  std::__cxx11::string::~string(local_30);
  return this->n_signature_rest;
}

Assistant:

bool _is_null_signature_rest() { signature_rest(); return n_signature_rest; }